

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int32_t nghttp2_session_get_stream_local_window_size(nghttp2_session *session,int32_t stream_id)

{
  nghttp2_stream *pnVar1;
  int32_t size;
  nghttp2_stream *stream;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  pnVar1 = nghttp2_session_get_stream(session,stream_id);
  if (pnVar1 == (nghttp2_stream *)0x0) {
    session_local._4_4_ = -1;
  }
  else {
    session_local._4_4_ = pnVar1->local_window_size - pnVar1->recv_window_size;
    if (session_local._4_4_ < 0) {
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

int32_t nghttp2_session_get_stream_local_window_size(nghttp2_session *session,
                                                     int32_t stream_id) {
  nghttp2_stream *stream;
  int32_t size;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL) {
    return -1;
  }

  size = stream->local_window_size - stream->recv_window_size;

  /* size could be negative if local endpoint reduced
     SETTINGS_INITIAL_WINDOW_SIZE */
  if (size < 0) {
    return 0;
  }

  return size;
}